

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

void __thiscall google::LogMessage::LogStream::~LogStream(LogStream *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_ostream)._vptr_basic_ostream[-3];
  p_Var1 = (_func_int *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var2);
  *(undefined ***)p_Var1 = &PTR__LogStream_00133bc0;
  *(undefined ***)(p_Var1 + 0x58) = &PTR__LogStream_00133be8;
  *(code **)(p_Var1 + 8) = __assert_fail;
  std::locale::~locale((locale *)(&(this->super_ostream).field_0x40 + (long)p_Var2));
  std::ios_base::~ios_base((ios_base *)(p_Var1 + 0x58));
  return;
}

Assistant:

class GOOGLE_GLOG_DLL_DECL LogStream : public std::ostream {
GLOG_MSVC_POP_WARNING()
  public:
    LogStream(char *buf, int len, int ctr)
        : std::ostream(NULL),
          streambuf_(buf, len),
          ctr_(ctr),
          self_(this) {
      rdbuf(&streambuf_);
    }

    int ctr() const { return ctr_; }
    void set_ctr(int ctr) { ctr_ = ctr; }
    LogStream* self() const { return self_; }

    // Legacy std::streambuf methods.
    size_t pcount() const { return streambuf_.pcount(); }
    char* pbase() const { return streambuf_.pbase(); }
    char* str() const { return pbase(); }

  private:
    LogStream(const LogStream&);
    LogStream& operator=(const LogStream&);
    base_logging::LogStreamBuf streambuf_;
    int ctr_;  // Counter hack (for the LOG_EVERY_X() macro)
    LogStream *self_;  // Consistency check hack
  }